

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mcu8str_create_from_staticbuffer(char *buf,mcu8str_size_t buflen)

{
  long in_RDX;
  char *in_RSI;
  mcu8str *in_RDI;
  
  if ((in_RDX == 0) || (0xfffffffd < in_RDX - 1U)) {
    mctools_impl_error((char *)0x10a4ff);
  }
  in_RDI->owns_memory = 0;
  in_RDI->c_str = in_RSI;
  *in_RDI->c_str = '\0';
  in_RDI->size = 0;
  in_RDI->buflen = (uint)in_RDX;
  return in_RDI;
}

Assistant:

mcu8str mcu8str_create_from_staticbuffer( char * buf, mcu8str_size_t buflen )
  {
    if ( buflen==0 || !MCTOOLS_STROKFORUINT(buflen-1) )
      mctools_impl_error("static buffer length out of range");
    assert(buflen > 0);
    mcu8str s;
    s.owns_memory = 0;
    s.c_str = buf;
    s.c_str[0] = '\0';
    s.size = 0;
    s.buflen = (unsigned)buflen;
    return s;
  }